

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-try-write-error.c
# Opt level: O2

void incoming_close_cb(uv_handle_t *handle)

{
  FILE *__stream;
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  undefined8 uStack_40;
  undefined1 local_30 [16];
  
  close_cb_called = close_cb_called + 1;
  local_30 = uv_buf_init("meow",4);
  uVar4 = 1;
  while (__stream = _stderr, iVar3 = (int)uVar4, 0 < iVar3) {
    uVar1 = uv_try_write(&client,local_30,1);
    uVar4 = (ulong)uVar1;
  }
  uVar2 = uv_strerror(uVar4);
  fprintf(__stream,"uv_try_write error: %d %s\n",uVar4,uVar2);
  if ((iVar3 + 0x68U < 2) || (iVar3 == -0x20)) {
    if (client.write_queue_size == 0) {
      return;
    }
    pcVar5 = "client.write_queue_size == 0";
    uStack_40 = 0x34;
  }
  else {
    pcVar5 = "r == UV_EPIPE || r == UV_ECONNABORTED || r == UV_ECONNRESET";
    uStack_40 = 0x33;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-try-write-error.c"
          ,uStack_40,pcVar5);
  abort();
}

Assistant:

static void incoming_close_cb(uv_handle_t* handle) {
  uv_buf_t buf;
  int r = 1;

  close_cb_called++;

  buf = uv_buf_init("meow", 4);
  while (r > 0)
    r = uv_try_write((uv_stream_t*) &client, &buf, 1);
  fprintf(stderr, "uv_try_write error: %d %s\n", r, uv_strerror(r));
  ASSERT(r == UV_EPIPE || r == UV_ECONNABORTED || r == UV_ECONNRESET);
  ASSERT(client.write_queue_size == 0);
}